

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O3

void __thiscall
DConversationMenu::DConversationMenu
          (DConversationMenu *this,FStrifeDialogueNode *CurNode,player_t *player)

{
  uint *puVar1;
  int *piVar2;
  FStrifeDialogueReply *reply;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  BYTE *__s1;
  FBrokenLines *pFVar8;
  char *pcVar9;
  BYTE *string;
  FString *other;
  char *copyStr;
  FString dlgtext;
  FString local_68 [4];
  TArray<unsigned_int,_unsigned_int> *local_48;
  FStrifeDialogueNode *local_40;
  char *local_38;
  
  DMenu::DMenu(&this->super_DMenu,(DMenu *)0x0);
  (this->super_DMenu).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_006f85c0;
  (this->mSpeaker).Chars = FString::NullString.Nothing;
  iVar6 = FString::NullString.RefCount;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_48 = &this->mResponses;
  (this->mResponses).Array = (uint *)0x0;
  (this->mResponses).Most = 0;
  (this->mResponses).Count = 0;
  (this->mResponseLines).Array = (FString *)0x0;
  (this->mResponseLines).Most = 0;
  (this->mResponseLines).Count = 0;
  this->mCurNode = CurNode;
  this->mPlayer = player;
  this->mDialogueLines = (FBrokenLines *)0x0;
  this->mShowGold = false;
  __s1 = (BYTE *)CurNode->Dialogue;
  local_40 = CurNode;
  iVar5 = strncmp((char *)__s1,"RANDOM_",7);
  local_38 = FString::NullString.Nothing;
  if (iVar5 == 0) {
    local_68[0].Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = iVar6 + 2;
    uVar7 = FRandom::GenRand32(&pr_randomspeech);
    FString::Format(local_68,"TXT_%s_%02d",__s1,
                    (ulong)(byte)((char)uVar7 + ((byte)((uVar7 & 0xff) / 5) & 0xfe) * -5 + 1));
    __s1 = (BYTE *)FStringTable::operator[](&GStrings,local_68[0].Chars);
    if (__s1 == (BYTE *)0x0) {
      __s1 = (BYTE *)FStringTable::operator[](&GStrings,"TXT_GOAWAY");
    }
    FString::~FString(local_68);
  }
  else if (*__s1 == '$') {
    __s1 = (BYTE *)FStringTable::operator()(&GStrings,(char *)(__s1 + 1));
  }
  string = ".";
  if (__s1 != (BYTE *)0x0) {
    string = __s1;
  }
  pFVar8 = V_BreakLines(SmallFont,
                        (screen->super_DSimpleCanvas).super_DCanvas.Width / CleanXfac + -0x30,string
                        ,false);
  this->mDialogueLines = pFVar8;
  for (reply = local_40->Children; reply != (FStrifeDialogueReply *)0x0; reply = reply->Next) {
    bVar4 = ShouldSkipReply(reply,this->mPlayer);
    if (!bVar4) {
      this->mShowGold = (bool)(this->mShowGold | reply->NeedsGold);
      pcVar9 = reply->Reply;
      if (*pcVar9 == '$') {
        pcVar9 = FStringTable::operator()(&GStrings,pcVar9 + 1);
      }
      FString::FString(local_68,pcVar9);
      if (reply->NeedsGold == true) {
        FString::AppendFormat(local_68," for %u",(ulong)(uint)((reply->ItemCheck).Array)->Amount);
      }
      pFVar8 = V_BreakLines(SmallFont,0x104,(BYTE *)local_68[0].Chars,false);
      uVar7 = (this->mResponseLines).Count;
      TArray<unsigned_int,_unsigned_int>::Grow(local_48,1);
      (this->mResponses).Array[(this->mResponses).Count] = uVar7;
      puVar1 = &(this->mResponses).Count;
      *puVar1 = *puVar1 + 1;
      if (-1 < pFVar8->Width) {
        other = &pFVar8->Text;
        do {
          TArray<FString,_FString>::Grow(&this->mResponseLines,1);
          FString::AttachToOther((this->mResponseLines).Array + (this->mResponseLines).Count,other);
          puVar1 = &(this->mResponseLines).Count;
          *puVar1 = *puVar1 + 1;
          piVar2 = (int *)(other + 1);
          other = other + 2;
        } while (-1 < *piVar2);
      }
      V_FreeBrokenLines(pFVar8);
      FString::~FString(local_68);
    }
  }
  pcVar9 = local_40->Goodbye;
  if (pcVar9 == (char *)0x0) {
    uVar7 = FRandom::GenRand32(&pr_randomspeech);
    mysnprintf((char *)local_68,0x19,"TXT_RANDOMGOODBYE_%d",
               (ulong)(byte)((char)uVar7 + (char)((uVar7 & 0xff) / 3) * -3 + 1));
    pcVar9 = FStringTable::operator[](&GStrings,(char *)local_68);
  }
  else {
    iVar6 = strncmp(pcVar9,"RANDOM_",7);
    if (iVar6 == 0) {
      local_68[0].Chars = local_38;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      uVar7 = FRandom::GenRand32(&pr_randomspeech);
      FString::Format(local_68,"TXT_%s_%02d",pcVar9,
                      (ulong)(byte)((char)uVar7 + ((byte)((uVar7 & 0xff) / 5) & 0xfe) * -5 + 1));
      pcVar9 = FStringTable::operator[](&GStrings,local_68[0].Chars);
      FString::~FString(local_68);
    }
    else if (*pcVar9 == '$') {
      pcVar9 = FStringTable::operator()(&GStrings,pcVar9 + 1);
    }
  }
  uVar7 = (this->mResponseLines).Count;
  TArray<unsigned_int,_unsigned_int>::Grow(local_48,1);
  (this->mResponses).Array[(this->mResponses).Count] = uVar7;
  puVar1 = &(this->mResponses).Count;
  *puVar1 = *puVar1 + 1;
  copyStr = "Bye.";
  if (pcVar9 != (char *)0x0) {
    copyStr = pcVar9;
  }
  FString::FString(local_68,copyStr);
  TArray<FString,_FString>::Grow(&this->mResponseLines,1);
  FString::AttachToOther((this->mResponseLines).Array + (this->mResponseLines).Count,local_68);
  puVar1 = &(this->mResponseLines).Count;
  *puVar1 = *puVar1 + 1;
  FString::~FString(local_68);
  ConversationMenuY = 0xc0 - (this->mResponseLines).Count * OptionSettings.mLinespacing;
  if (0x8b < ConversationMenuY) {
    ConversationMenuY = 0x8c;
  }
  this->mYpos = ConversationMenuY;
  pFVar8 = this->mDialogueLines;
  iVar6 = 0x86;
  do {
    iVar6 = iVar6 + 10;
    piVar2 = &pFVar8->Width;
    pFVar8 = pFVar8 + 1;
  } while (-1 < *piVar2);
  uVar3 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Height / (long)CleanYfac;
  iVar5 = (int)(((uint)(uVar3 >> 0x1f) & 1) + (int)uVar3) >> 1;
  if (ConversationMenuY + -100 < (iVar6 - iVar5) + -100) {
    ConversationMenuY = iVar6 - iVar5;
    this->mYpos = ConversationMenuY;
  }
  uVar7 = (this->mResponses).Count;
  if ((int)uVar7 <= mSelection) {
    mSelection = uVar7 - 1;
  }
  return;
}

Assistant:

DConversationMenu(FStrifeDialogueNode *CurNode, player_t *player)
	{
		mCurNode = CurNode;
		mPlayer = player;
		mDialogueLines = NULL;
		mShowGold = false;

		// Format the speaker's message.
		const char * toSay = CurNode->Dialogue;
		if (strncmp (toSay, "RANDOM_", 7) == 0)
		{
			FString dlgtext;

			dlgtext.Format("TXT_%s_%02d", toSay, 1+(pr_randomspeech() % NUM_RANDOM_LINES));
			toSay = GStrings[dlgtext];
			if (toSay == NULL)
			{
				toSay = GStrings["TXT_GOAWAY"];	// Ok, it's lame - but it doesn't look like an error to the player. ;)
			}
		}
		else
		{
			// handle string table replacement
			if (toSay[0] == '$')
			{
				toSay = GStrings(toSay + 1);
			}
		}
		if (toSay == NULL)
		{
			toSay = ".";
		}
		mDialogueLines = V_BreakLines (SmallFont, screen->GetWidth()/CleanXfac - 24*2, toSay);

		FStrifeDialogueReply *reply;
		int i,j;
		for (reply = CurNode->Children, i = 1; reply != NULL; reply = reply->Next)
		{
			if (ShouldSkipReply(reply, mPlayer))
			{
				continue;
			}
			mShowGold |= reply->NeedsGold;

			const char *ReplyText = reply->Reply;
			if (ReplyText[0] == '$')
			{
				ReplyText = GStrings(ReplyText + 1);
			}
			FString ReplyString = ReplyText;
			if (reply->NeedsGold) ReplyString.AppendFormat(" for %u", reply->ItemCheck[0].Amount);

			FBrokenLines *ReplyLines = V_BreakLines (SmallFont, 320-50-10, ReplyString);

			mResponses.Push(mResponseLines.Size());
			for (j = 0; ReplyLines[j].Width >= 0; ++j)
			{
				mResponseLines.Push(ReplyLines[j].Text);
			}
			++i;
			V_FreeBrokenLines (ReplyLines);
		}
		const char *goodbyestr = CurNode->Goodbye;
		if (goodbyestr == nullptr)
		{
			char goodbye[25];
			mysnprintf(goodbye, countof(goodbye), "TXT_RANDOMGOODBYE_%d", 1 + (pr_randomspeech() % NUM_RANDOM_GOODBYES));
			goodbyestr = GStrings[goodbye];
		}
		else if (strncmp(goodbyestr, "RANDOM_", 7) == 0)
		{
			FString byetext;

			byetext.Format("TXT_%s_%02d", goodbyestr, 1 + (pr_randomspeech() % NUM_RANDOM_LINES));
			goodbyestr = GStrings[byetext];
		}
		else if (goodbyestr[0] == '$')
		{
			goodbyestr = GStrings(goodbyestr + 1);
		}
		if (goodbyestr == nullptr) goodbyestr = "Bye.";
		mResponses.Push(mResponseLines.Size());
		mResponseLines.Push(FString(goodbyestr));

		// Determine where the top of the reply list should be positioned.
		i = OptionSettings.mLinespacing;
		mYpos = MIN<int> (140, 192 - mResponseLines.Size() * i);
		for (i = 0; mDialogueLines[i].Width >= 0; ++i)
		{ }
		i = 44 + i * 10;
		if (mYpos - 100 < i - screen->GetHeight() / CleanYfac / 2)
		{
			mYpos = i - screen->GetHeight() / CleanYfac / 2 + 100;
		}
		ConversationMenuY = mYpos;
		//ConversationMenu.indent = 50;

		// Because replies can be selectively hidden mResponses.Size() won't be consistent.
		// So make sure mSelection doesn't exceed mResponses.Size(). [FishyClockwork]
		if (mSelection >= (int)mResponses.Size())
		{
			mSelection = mResponses.Size() - 1;
		}
	}